

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getters-setters.c
# Opt level: O1

int run_test_handle_type_name(void)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  size_t sVar4;
  long *__ptr;
  int *piVar5;
  long *plVar6;
  void *__ptr_00;
  long lVar7;
  char *pcVar8;
  undefined8 uVar9;
  long *unaff_RBX;
  long *unaff_R14;
  undefined1 auStack_4fc [4];
  undefined1 auStack_4f8 [16];
  char acStack_4e8 [120];
  char acStack_470 [216];
  char acStack_398 [312];
  char acStack_260 [248];
  char acStack_168 [264];
  long *plStack_60;
  long *plStack_58;
  long lStack_48;
  undefined8 uStack_40;
  
  pcVar2 = (char *)uv_handle_type_name(7);
  iVar1 = strcmp(pcVar2,"pipe");
  if (iVar1 == 0) {
    pcVar2 = (char *)uv_handle_type_name(0xf);
    iVar1 = strcmp(pcVar2,"udp");
    if (iVar1 != 0) goto LAB_0015c63b;
    pcVar2 = (char *)uv_handle_type_name(0x11);
    iVar1 = strcmp(pcVar2,"file");
    if (iVar1 != 0) goto LAB_0015c640;
    lVar3 = uv_handle_type_name(0x12);
    if (lVar3 != 0) goto LAB_0015c645;
    lVar3 = uv_handle_type_name(0x13);
    if (lVar3 != 0) goto LAB_0015c64a;
    lVar3 = uv_handle_type_name(0);
    if (lVar3 == 0) {
      return 0;
    }
  }
  else {
    run_test_handle_type_name_cold_1();
LAB_0015c63b:
    run_test_handle_type_name_cold_2();
LAB_0015c640:
    run_test_handle_type_name_cold_3();
LAB_0015c645:
    run_test_handle_type_name_cold_4();
LAB_0015c64a:
    run_test_handle_type_name_cold_5();
  }
  run_test_handle_type_name_cold_6();
  pcVar2 = (char *)uv_req_type_name(1);
  iVar1 = strcmp(pcVar2,"req");
  if (iVar1 == 0) {
    pcVar2 = (char *)uv_req_type_name(5);
    iVar1 = strcmp(pcVar2,"udp_send");
    if (iVar1 != 0) goto LAB_0015c6df;
    pcVar2 = (char *)uv_req_type_name(7);
    iVar1 = strcmp(pcVar2,"work");
    if (iVar1 != 0) goto LAB_0015c6e4;
    lVar3 = uv_req_type_name(0xb);
    if (lVar3 != 0) goto LAB_0015c6e9;
    lVar3 = uv_req_type_name(0xc);
    if (lVar3 != 0) goto LAB_0015c6ee;
    lVar3 = uv_req_type_name(0);
    if (lVar3 == 0) {
      return 0;
    }
  }
  else {
    run_test_req_type_name_cold_1();
LAB_0015c6df:
    run_test_req_type_name_cold_2();
LAB_0015c6e4:
    run_test_req_type_name_cold_3();
LAB_0015c6e9:
    run_test_req_type_name_cold_4();
LAB_0015c6ee:
    run_test_req_type_name_cold_5();
  }
  run_test_req_type_name_cold_6();
  uStack_40 = 0x15c705;
  sVar4 = uv_loop_size();
  uStack_40 = 0x15c70d;
  __ptr = (long *)malloc(sVar4);
  if (__ptr == (long *)0x0) {
    uStack_40 = 0x15c90d;
    run_test_getters_setters_cold_19();
LAB_0015c90d:
    uStack_40 = 0x15c912;
    run_test_getters_setters_cold_1();
LAB_0015c912:
    uStack_40 = 0x15c917;
    run_test_getters_setters_cold_2();
LAB_0015c917:
    uStack_40 = 0x15c91c;
    run_test_getters_setters_cold_3();
LAB_0015c91c:
    uStack_40 = 0x15c921;
    run_test_getters_setters_cold_4();
LAB_0015c921:
    uStack_40 = 0x15c926;
    run_test_getters_setters_cold_5();
LAB_0015c926:
    uStack_40 = 0x15c92b;
    run_test_getters_setters_cold_6();
LAB_0015c92b:
    uStack_40 = 0x15c930;
    run_test_getters_setters_cold_7();
LAB_0015c930:
    uStack_40 = 0x15c935;
    run_test_getters_setters_cold_8();
LAB_0015c935:
    uStack_40 = 0x15c93a;
    run_test_getters_setters_cold_9();
LAB_0015c93a:
    uStack_40 = 0x15c93f;
    run_test_getters_setters_cold_10();
LAB_0015c93f:
    uStack_40 = 0x15c944;
    run_test_getters_setters_cold_11();
LAB_0015c944:
    uStack_40 = 0x15c949;
    run_test_getters_setters_cold_12();
LAB_0015c949:
    uStack_40 = 0x15c94e;
    run_test_getters_setters_cold_13();
LAB_0015c94e:
    uStack_40 = 0x15c953;
    run_test_getters_setters_cold_14();
LAB_0015c953:
    uStack_40 = 0x15c958;
    run_test_getters_setters_cold_15();
LAB_0015c958:
    uStack_40 = 0x15c95d;
    run_test_getters_setters_cold_18();
LAB_0015c95d:
    uStack_40 = 0x15c962;
    run_test_getters_setters_cold_16();
  }
  else {
    uStack_40 = 0x15c721;
    iVar1 = uv_loop_init(__ptr);
    unaff_RBX = __ptr;
    if (iVar1 != 0) goto LAB_0015c90d;
    uStack_40 = 0x15c73b;
    uv_loop_set_data(__ptr,&cookie1);
    if ((int *)*__ptr != &cookie1) goto LAB_0015c912;
    uStack_40 = 0x15c74c;
    piVar5 = (int *)uv_loop_get_data(__ptr);
    if (piVar5 != &cookie1) goto LAB_0015c917;
    uStack_40 = 0x15c75f;
    sVar4 = uv_handle_size(7);
    uStack_40 = 0x15c767;
    unaff_R14 = (long *)malloc(sVar4);
    uStack_40 = 0x15c777;
    uv_pipe_init(__ptr,unaff_R14,0);
    uStack_40 = 0x15c77f;
    iVar1 = uv_handle_get_type(unaff_R14);
    if (iVar1 != 7) goto LAB_0015c91c;
    uStack_40 = 0x15c790;
    plVar6 = (long *)uv_handle_get_loop(unaff_R14);
    if (plVar6 != __ptr) goto LAB_0015c921;
    *unaff_R14 = (long)&cookie2;
    uStack_40 = 0x15c7ab;
    piVar5 = (int *)uv_handle_get_data(unaff_R14);
    if (piVar5 != &cookie2) goto LAB_0015c926;
    uStack_40 = 0x15c7bf;
    uv_handle_set_data(unaff_R14,&cookie1);
    uStack_40 = 0x15c7c7;
    piVar5 = (int *)uv_handle_get_data(unaff_R14);
    if (piVar5 != &cookie1) goto LAB_0015c92b;
    if ((int *)*unaff_R14 != &cookie1) goto LAB_0015c930;
    uStack_40 = 0x15c7e1;
    lVar3 = uv_stream_get_write_queue_size(unaff_R14);
    if (lVar3 != 0) goto LAB_0015c935;
    unaff_R14[0xc] = unaff_R14[0xc] + 1;
    uStack_40 = 0x15c7f6;
    lVar3 = uv_stream_get_write_queue_size(unaff_R14);
    if (lVar3 != 1) goto LAB_0015c93a;
    unaff_R14[0xc] = unaff_R14[0xc] + -1;
    uStack_40 = 0x15c80e;
    uv_close(unaff_R14,0);
    uStack_40 = 0x15c818;
    iVar1 = uv_run(__ptr,0);
    if (iVar1 != 0) goto LAB_0015c93f;
    uStack_40 = 0x15c82a;
    sVar4 = uv_req_size(6);
    uStack_40 = 0x15c832;
    __ptr_00 = malloc(sVar4);
    uStack_40 = 0x15c849;
    uv_fs_stat(__ptr,__ptr_00,".",0);
    uStack_40 = 0x15c853;
    iVar1 = uv_run(__ptr,0);
    if (iVar1 != 0) goto LAB_0015c944;
    uStack_40 = 0x15c863;
    iVar1 = uv_fs_get_type(__ptr_00);
    if (iVar1 != 6) goto LAB_0015c949;
    uStack_40 = 0x15c874;
    lVar3 = uv_fs_get_result(__ptr_00);
    if (lVar3 != 0) goto LAB_0015c94e;
    uStack_40 = 0x15c885;
    lVar3 = uv_fs_get_ptr(__ptr_00);
    uStack_40 = 0x15c890;
    lVar7 = uv_fs_get_statbuf(__ptr_00);
    if (lVar3 != lVar7) goto LAB_0015c953;
    uStack_40 = 0x15c8a1;
    lVar3 = uv_fs_get_statbuf(__ptr_00);
    if ((*(byte *)(lVar3 + 9) & 0x40) == 0) goto LAB_0015c958;
    uStack_40 = 0x15c8b3;
    pcVar2 = (char *)uv_fs_get_path(__ptr_00);
    uStack_40 = 0x15c8c2;
    iVar1 = strcmp(pcVar2,".");
    if (iVar1 != 0) goto LAB_0015c95d;
    uStack_40 = 0x15c8d2;
    uv_fs_req_cleanup(__ptr_00);
    uStack_40 = 0x15c8da;
    iVar1 = uv_loop_close(__ptr);
    if (iVar1 == 0) {
      uStack_40 = 0x15c8ea;
      free(unaff_R14);
      uStack_40 = 0x15c8f2;
      free(__ptr_00);
      uStack_40 = 0x15c8fa;
      free(__ptr);
      return 0;
    }
  }
  uStack_40 = 0x15c967;
  run_test_getters_setters_cold_17();
  lStack_48 = 0;
  plStack_58 = (long *)0x15c97d;
  iVar1 = uv_gettimeofday();
  if (iVar1 == 0) {
    if (lStack_48 == 0) goto LAB_0015c9a1;
    plStack_58 = (long *)0x15c990;
    iVar1 = uv_gettimeofday(0);
    if (iVar1 == -0x16) {
      return 0;
    }
  }
  else {
    plStack_58 = (long *)0x15c9a1;
    run_test_gettimeofday_cold_1();
LAB_0015c9a1:
    plStack_58 = (long *)0x15c9a6;
    run_test_gettimeofday_cold_3();
  }
  plStack_58 = (long *)0x15c9ab;
  run_test_gettimeofday_cold_2();
  plStack_60 = unaff_RBX;
  plStack_58 = unaff_R14;
  pcVar8 = (char *)uv_default_loop();
  pcVar2 = "127.0.0.1";
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_4f8);
  if (iVar1 == 0) {
    pcVar2 = pcVar8;
    iVar1 = uv_idle_init(pcVar8,acStack_4e8);
    if (iVar1 != 0) goto LAB_0015cced;
    pcVar2 = acStack_4e8;
    iVar1 = uv_fileno(pcVar2,auStack_4fc);
    if (iVar1 != -0x16) goto LAB_0015ccf2;
    uv_close(acStack_4e8,0);
    pcVar2 = pcVar8;
    iVar1 = uv_tcp_init(pcVar8,acStack_260);
    if (iVar1 != 0) goto LAB_0015ccf7;
    pcVar2 = acStack_260;
    iVar1 = uv_fileno(pcVar2,auStack_4fc);
    if (iVar1 != -9) goto LAB_0015ccfc;
    pcVar2 = acStack_260;
    iVar1 = uv_tcp_bind(pcVar2,auStack_4f8,0);
    if (iVar1 != 0) goto LAB_0015cd01;
    pcVar2 = acStack_260;
    iVar1 = uv_fileno(pcVar2,auStack_4fc);
    if (iVar1 != 0) goto LAB_0015cd06;
    pcVar2 = acStack_260;
    uv_close(pcVar2,0);
    iVar1 = uv_fileno(pcVar2,auStack_4fc);
    if (iVar1 != -9) goto LAB_0015cd0b;
    pcVar2 = pcVar8;
    iVar1 = uv_udp_init(pcVar8,acStack_470);
    if (iVar1 != 0) goto LAB_0015cd10;
    pcVar2 = acStack_470;
    iVar1 = uv_fileno(pcVar2,auStack_4fc);
    if (iVar1 != -9) goto LAB_0015cd15;
    pcVar2 = acStack_470;
    iVar1 = uv_udp_bind(pcVar2,auStack_4f8,0);
    if (iVar1 != 0) goto LAB_0015cd1a;
    pcVar2 = acStack_470;
    iVar1 = uv_fileno(pcVar2,auStack_4fc);
    if (iVar1 != 0) goto LAB_0015cd1f;
    pcVar2 = acStack_470;
    uv_close(pcVar2,0);
    iVar1 = uv_fileno(pcVar2,auStack_4fc);
    if (iVar1 != -9) goto LAB_0015cd24;
    pcVar2 = pcVar8;
    iVar1 = uv_pipe_init(pcVar8,acStack_168,0);
    if (iVar1 != 0) goto LAB_0015cd29;
    pcVar2 = acStack_168;
    iVar1 = uv_fileno(pcVar2,auStack_4fc);
    if (iVar1 != -9) goto LAB_0015cd2e;
    pcVar2 = acStack_168;
    iVar1 = uv_pipe_bind(pcVar2,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_0015cd33;
    pcVar2 = acStack_168;
    iVar1 = uv_fileno(pcVar2,auStack_4fc);
    if (iVar1 != 0) goto LAB_0015cd38;
    pcVar2 = acStack_168;
    uv_close(pcVar2,0);
    iVar1 = uv_fileno(pcVar2);
    if (iVar1 != -9) goto LAB_0015cd3d;
    iVar1 = open64("/dev/tty",0,0);
    if (iVar1 < 0) {
      run_test_handle_fileno_cold_26();
LAB_0015cc96:
      uv_run(pcVar8,0);
      uVar9 = uv_default_loop();
      uv_walk(uVar9,close_walk_cb,0);
      uv_run(uVar9,0);
      pcVar2 = (char *)uv_default_loop();
      iVar1 = uv_loop_close(pcVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015cd42;
    }
    pcVar2 = pcVar8;
    iVar1 = uv_tty_init(pcVar8,acStack_398,iVar1,0);
    if (iVar1 != 0) goto LAB_0015cd47;
    pcVar2 = acStack_398;
    iVar1 = uv_is_readable(pcVar2);
    if (iVar1 == 0) goto LAB_0015cd4c;
    pcVar2 = acStack_398;
    iVar1 = uv_is_writable(pcVar2);
    if (iVar1 != 0) goto LAB_0015cd51;
    pcVar2 = acStack_398;
    iVar1 = uv_fileno(pcVar2,auStack_4fc);
    if (iVar1 != 0) goto LAB_0015cd56;
    pcVar2 = acStack_398;
    uv_close(pcVar2,0);
    iVar1 = uv_fileno(pcVar2,auStack_4fc);
    if (iVar1 != -9) goto LAB_0015cd5b;
    pcVar2 = acStack_398;
    iVar1 = uv_is_readable(pcVar2);
    if (iVar1 == 0) {
      pcVar2 = acStack_398;
      iVar1 = uv_is_writable(pcVar2);
      if (iVar1 != 0) goto LAB_0015cd65;
      goto LAB_0015cc96;
    }
  }
  else {
    run_test_handle_fileno_cold_1();
LAB_0015cced:
    run_test_handle_fileno_cold_2();
LAB_0015ccf2:
    run_test_handle_fileno_cold_3();
LAB_0015ccf7:
    run_test_handle_fileno_cold_4();
LAB_0015ccfc:
    run_test_handle_fileno_cold_5();
LAB_0015cd01:
    run_test_handle_fileno_cold_6();
LAB_0015cd06:
    run_test_handle_fileno_cold_7();
LAB_0015cd0b:
    run_test_handle_fileno_cold_8();
LAB_0015cd10:
    run_test_handle_fileno_cold_9();
LAB_0015cd15:
    run_test_handle_fileno_cold_10();
LAB_0015cd1a:
    run_test_handle_fileno_cold_11();
LAB_0015cd1f:
    run_test_handle_fileno_cold_12();
LAB_0015cd24:
    run_test_handle_fileno_cold_13();
LAB_0015cd29:
    run_test_handle_fileno_cold_14();
LAB_0015cd2e:
    run_test_handle_fileno_cold_15();
LAB_0015cd33:
    run_test_handle_fileno_cold_16();
LAB_0015cd38:
    run_test_handle_fileno_cold_17();
LAB_0015cd3d:
    run_test_handle_fileno_cold_18();
LAB_0015cd42:
    run_test_handle_fileno_cold_27();
LAB_0015cd47:
    run_test_handle_fileno_cold_19();
LAB_0015cd4c:
    run_test_handle_fileno_cold_25();
LAB_0015cd51:
    run_test_handle_fileno_cold_20();
LAB_0015cd56:
    run_test_handle_fileno_cold_21();
LAB_0015cd5b:
    run_test_handle_fileno_cold_22();
  }
  run_test_handle_fileno_cold_23();
LAB_0015cd65:
  run_test_handle_fileno_cold_24();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(pcVar2,0);
  return iVar1;
}

Assistant:

TEST_IMPL(handle_type_name) {
  ASSERT(strcmp(uv_handle_type_name(UV_NAMED_PIPE), "pipe") == 0);
  ASSERT(strcmp(uv_handle_type_name(UV_UDP), "udp") == 0);
  ASSERT(strcmp(uv_handle_type_name(UV_FILE), "file") == 0);
  ASSERT(uv_handle_type_name(UV_HANDLE_TYPE_MAX) == NULL);
  ASSERT(uv_handle_type_name(UV_HANDLE_TYPE_MAX + 1) == NULL);
  ASSERT(uv_handle_type_name(UV_UNKNOWN_HANDLE) == NULL);
  return 0;
}